

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void ossl_closeone(Curl_easy *data,connectdata *conn,ssl_connect_data *connssl)

{
  ssl_backend_data *psVar1;
  SSL *ssl;
  char buf [32];
  
  psVar1 = connssl->backend;
  ssl = (SSL *)psVar1->handle;
  if (ssl != (SSL *)0x0) {
    (conn->ssl[0].backend)->logger = data;
    SSL_read(ssl,buf,0x20);
    SSL_shutdown((SSL *)psVar1->handle);
    SSL_set_connect_state((SSL *)psVar1->handle);
    SSL_free((SSL *)psVar1->handle);
    psVar1->handle = (SSL *)0x0;
  }
  if ((SSL_CTX *)psVar1->ctx != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)psVar1->ctx);
    psVar1->ctx = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

static void ossl_closeone(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct ssl_connect_data *connssl)
{
  struct ssl_backend_data *backend = connssl->backend;
  if(backend->handle) {
    char buf[32];
    set_logger(conn, data);

    /* Maybe the server has already sent a close notify alert.
       Read it to avoid an RST on the TCP connection. */
    (void)SSL_read(backend->handle, buf, (int)sizeof(buf));

    (void)SSL_shutdown(backend->handle);
    SSL_set_connect_state(backend->handle);

    SSL_free(backend->handle);
    backend->handle = NULL;
  }
  if(backend->ctx) {
    SSL_CTX_free(backend->ctx);
    backend->ctx = NULL;
  }
}